

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.h
# Opt level: O1

void * __thiscall
CVmVarHeapHybrid_malloc::realloc(CVmVarHeapHybrid_malloc *this,void *__ptr,size_t __size)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)::realloc(__ptr,__size + 0xf & 0xfffffffffffffff8);
  *puVar1 = this;
  return puVar1 + 1;
}

Assistant:

virtual void *realloc(struct CVmVarHeapHybrid_hdr *mem, size_t siz,
                          CVmObject *)
    {
        CVmVarHeapHybrid_hdr *ptr;
        
        /* adjust the new size to add in the required header */
        siz = osrndsz(siz + sizeof(CVmVarHeapHybrid_hdr));

        /* reallocate the block */
        ptr = (CVmVarHeapHybrid_hdr *)t3realloc(mem, siz);

        /* fill in the header in the new block */
        ptr->block = this;

        /* return the caller-visible part of the new block */
        return (void *)(ptr + 1);
    }